

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t terminal_get_size(EditLine *el,wchar_t *lins,wchar_t *cols)

{
  wchar_t *pwVar1;
  int iVar2;
  wchar_t wVar3;
  winsize ws;
  ushort local_20;
  ushort local_1e;
  
  pwVar1 = (el->el_terminal).t_val;
  *cols = pwVar1[3];
  *lins = pwVar1[2];
  iVar2 = ioctl(el->el_infd,0x5413,&local_20);
  if (iVar2 != -1) {
    if (local_1e != 0) {
      *cols = (uint)local_1e;
    }
    if (local_20 != 0) {
      *lins = (uint)local_20;
    }
  }
  pwVar1 = (el->el_terminal).t_val;
  wVar3 = L'\x01';
  if (pwVar1[3] == *cols) {
    wVar3 = (wchar_t)(pwVar1[2] != *lins);
  }
  return wVar3;
}

Assistant:

libedit_private int
terminal_get_size(EditLine *el, int *lins, int *cols)
{

	*cols = Val(T_co);
	*lins = Val(T_li);

#ifdef TIOCGWINSZ
	{
		struct winsize ws;
		if (ioctl(el->el_infd, TIOCGWINSZ, &ws) != -1) {
			if (ws.ws_col)
				*cols = ws.ws_col;
			if (ws.ws_row)
				*lins = ws.ws_row;
		}
	}
#endif
#ifdef TIOCGSIZE
	{
		struct ttysize ts;
		if (ioctl(el->el_infd, TIOCGSIZE, &ts) != -1) {
			if (ts.ts_cols)
				*cols = ts.ts_cols;
			if (ts.ts_lines)
				*lins = ts.ts_lines;
		}
	}
#endif
	return Val(T_co) != *cols || Val(T_li) != *lins;
}